

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

void ERR_SAVE_STATE_free(ERR_SAVE_STATE *state)

{
  undefined8 *puVar1;
  err_error_st *peVar2;
  long lVar3;
  ulong uVar4;
  
  if (state != (ERR_SAVE_STATE *)0x0) {
    if (state->num_errors != 0) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        peVar2 = state->errors;
        free(*(void **)((long)&peVar2->file + lVar3));
        puVar1 = (undefined8 *)((long)peVar2 + lVar3 + -8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&peVar2->data + lVar3) = 0;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 < state->num_errors);
    }
    free(state->errors);
    free(state);
    return;
  }
  return;
}

Assistant:

void ERR_SAVE_STATE_free(ERR_SAVE_STATE *state) {
  if (state == NULL) {
    return;
  }
  for (size_t i = 0; i < state->num_errors; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->errors);
  free(state);
}